

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O2

void __thiscall
CTestResource_TestPlanar2D_RGBP_Unaligned_Test::TestBody
          (CTestResource_TestPlanar2D_RGBP_Unaligned_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar1;
  uint uVar2;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar3;
  char *pcVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  undefined1 auStack_158 [8];
  GMM_RESCREATE_PARAMS gmmParams;
  ulong uStack_b8;
  AssertionResult gtest_ar;
  unsigned_long local_88 [7];
  AssertHelper local_50;
  undefined8 local_48;
  AssertionResult gtest_ar_6;
  GMM_MULTI_TILE_ARCH GVar4;
  
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    gmmParams.pExistingSysMem = 0;
    gmmParams.MaximumRenamingListLength = 0;
    gmmParams.NoGfxMemory = '\0';
    gmmParams._109_3_ = 0;
    gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams.BaseAlignment = 0;
    gmmParams.OverridePitch = 0;
    gmmParams.RotateInfo = 0;
    gmmParams._84_4_ = 0;
    gmmParams.BaseHeight = 0;
    gmmParams.Depth = 0;
    gmmParams.MaxLod = 0;
    gmmParams.ArraySize = 0;
    gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams.MSAA.NumSamples = 0;
    gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    auStack_158._0_4_ = RESOURCE_2D;
    auStack_158._4_4_ = GMM_FORMAT_INVALID;
    gmmParams.ExistingSysMemSize = 0x100000000;
    gmmParams.Type = RESOURCE_INVALID;
    gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams.CpTag = 0x1e0;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x10000012c;
    CTestResource::SetTileFlag
              (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)auStack_158,
               *(TEST_TILE_TYPE *)((long)&DAT_0018f190 + lVar8));
    auStack_158._4_4_ = GMM_FORMAT_RGBP;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,(GMM_RESCREATE_PARAMS *)auStack_158);
    if (lVar8 == 0) {
      uVar3 = gmmParams.CpTag + 0x3f & 0xffffffc0;
      uVar6 = gmmParams.field_6.BaseWidth;
    }
    else {
      iVar7 = *(int *)((long)&DAT_0018f1a0 + lVar8 * 2);
      iVar1 = *(int *)((long)&DAT_0018f1a4 + lVar8 * 2);
      uVar3 = -iVar7 & iVar7 + -1 + gmmParams.CpTag;
      uVar6 = -iVar1 & iVar1 + -1 + (gmmParams.field_6.BaseWidth + 0xf & 0xfffffff0);
    }
    GVar4.Reserved = 0;
    GVar4._0_4_ = uVar3;
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,uVar3);
    if (lVar8 != 0) {
      CTestResource::VerifyResourcePitchInTiles<true>
                (&this->super_CTestResource,ResourceInfo,
                 uVar3 / *(uint *)((long)&DAT_0018f1a0 + lVar8 * 2));
    }
    uVar2 = uVar6 * 3;
    gmmParams.MultiTileArch = GVar4;
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,ResourceInfo,(ulong)(uVar2 * uVar3 + 0xfff & 0xfffff000));
    gtest_ar_6.message_.ptr_._0_4_ = 0;
    local_48 = (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,1);
    this_00 = &gtest_ar_6.message_;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",
               (int *)this_00,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb95,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar_6.message_.ptr_._0_4_ = 0;
    local_48 = (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,1);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",
               (int *)this_00,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb96,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar_6.message_.ptr_._0_4_ = 0;
    local_48 = (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,2);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",
               (int *)this_00,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb99,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uVar3 = uVar2 / 3;
    gtest_ar_6.message_.ptr_._0_4_ = uVar3;
    local_48 = (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,2,(ulong)uVar2 % 3);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&uStack_b8,"Height / 3","ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",
               (uint *)this_00,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9a,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar_6.message_.ptr_._0_4_ = 0;
    local_48 = (**(code **)(*(long *)ResourceInfo + 0x210))(ResourceInfo,3);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&uStack_b8,"0","ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",
               (int *)this_00,(unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar_6.message_.ptr_._0_4_ = uVar3 * 2;
    local_48 = (**(code **)(*(long *)ResourceInfo + 0x218))(ResourceInfo,3);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&uStack_b8,"2 * (Height / 3)",
               "ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",(uint *)this_00,
               (unsigned_long *)&local_48);
    if (uStack_b8._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xb9e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    local_88[4] = 0;
    local_88[5] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    uStack_b8 = 1;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&uStack_b8);
    gtest_ar_6.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,local_88);
    if (local_48._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar_6._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar_6._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xba7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_6);
    uStack_b8 = uStack_b8 | 1;
    gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
    gtest_ar.message_.ptr_._4_4_ = 2;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&uStack_b8);
    iVar7 = uVar3 * gmmParams.MultiTileArch._0_4_;
    gtest_ar_6.message_.ptr_._0_4_ = iVar7;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&local_48,"Pitch * (Height / 3)","OffsetInfo.Render.Offset64",
               (uint *)this_00,local_88);
    if (local_48._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar_6._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar_6._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xbae,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_6);
    uStack_b8 = uStack_b8 | 1;
    gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
    gtest_ar.message_.ptr_._4_4_ = 3;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&uStack_b8);
    gtest_ar_6.message_.ptr_._0_4_ = iVar7 * 2;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&local_48,"2 * Pitch * (Height / 3)","OffsetInfo.Render.Offset64",
               (uint *)this_00,local_88);
    if (local_48._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar_6._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar_6._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xbb5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_6);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
  }
  return;
}

Assistant:

TEST_F(CTestResource, TestPlanar2D_RGBP_Unaligned)
{
    /* Test planar surfaces where all planes are full-sized */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // UUUUUUUU
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    // VVVVVVVV
    const TEST_TILE_TYPE TileTypes[]       = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};
    const uint32_t       PlaneRowAlignment = 16;

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                     {512, 8},   // TileX
                                     {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = 480;
        gmmParams.BaseHeight           = 300;
        gmmParams.Depth                = 0x1;
        SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_RGBP;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t Pitch, Height;
        if(Tile != TEST_LINEAR)
        {
            Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);
            //Since Tile alignment factor is greater than GMM_IMCx_PLANE_ROW_ALIGNMENT=16
            Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment);
            Height = GMM_ULT_ALIGN(Height, TileSize[TileIndex][1]) * 3 /*Y, U, V*/;
        }
        else
        {
            Pitch  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, GMM_BYTES(64));
            Height = gmmParams.BaseHeight * 3 /*Y, U, V*/;
        }
        uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }

        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(Height / 3, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

        // V plane should be at end of U plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
        EXPECT_EQ(2 * (Height / 3), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

        //Resource Offset
        //Y PLANE
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        OffsetInfo.Plane               = GMM_PLANE_Y;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);

        //U PLANE
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 0; //Mip 0
        OffsetInfo.Plane     = GMM_PLANE_U;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(Pitch * (Height / 3), OffsetInfo.Render.Offset64);

        // V PLANE
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 0; //Mip 0
        OffsetInfo.Plane     = GMM_PLANE_V;
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(2 * Pitch * (Height / 3), OffsetInfo.Render.Offset64);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}